

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int isoent_add_child_tail(isoent *parent,isoent *child)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  archive_rb_node *in_stack_00000010;
  archive_rb_tree *in_stack_00000018;
  undefined4 local_4;
  
  iVar1 = __archive_rb_tree_insert_node(in_stack_00000018,in_stack_00000010);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    *(undefined8 *)(in_RSI + 0x70) = 0;
    **(long **)(in_RDI + 0x30) = in_RSI;
    *(long *)(in_RDI + 0x30) = in_RSI + 0x70;
    *(int *)(in_RDI + 0x38) = *(int *)(in_RDI + 0x38) + 1;
    *(long *)(in_RSI + 0x20) = in_RDI;
    *(undefined8 *)(in_RSI + 0x78) = 0;
    if ((char)(*(char *)(in_RSI + 0xe8) << 6) < '\0') {
      **(long **)(in_RDI + 0x58) = in_RSI;
      *(long *)(in_RDI + 0x58) = in_RSI + 0x78;
      *(int *)(in_RDI + 0x60) = *(int *)(in_RDI + 0x60) + 1;
      *(long *)(in_RSI + 0x20) = in_RDI;
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int
isoent_add_child_tail(struct isoent *parent, struct isoent *child)
{

	if (!__archive_rb_tree_insert_node(
	    &(parent->rbtree), (struct archive_rb_node *)child))
		return (0);
	child->chnext = NULL;
	*parent->children.last = child;
	parent->children.last = &(child->chnext);
	parent->children.cnt++;
	child->parent = parent;

	/* Add a child to a sub-directory chain */
	child->drnext = NULL;
	if (child->dir) {
		*parent->subdirs.last = child;
		parent->subdirs.last = &(child->drnext);
		parent->subdirs.cnt++;
		child->parent = parent;
	}
	return (1);
}